

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.cpp
# Opt level: O0

anon_unknown_16 * __thiscall
stackjit::anon_unknown_16::findInheritedMemberFunction
          (anon_unknown_16 *this,VMState *vmState,string *initialSignature,ClassType *classType,
          string *name,
          vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  Binder *this_00;
  ClassMetadata *pCVar4;
  ClassType *pCVar5;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_e0;
  string local_c8 [32];
  undefined4 local_a8;
  string local_98 [32];
  FunctionSignature local_78;
  string local_58 [8];
  string signature;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters_local;
  string *name_local;
  ClassType *classType_local;
  string *initialSignature_local;
  VMState *vmState_local;
  
  std::__cxx11::string::string(local_98,(string *)name);
  FunctionSignature::memberFunction(&local_78,classType,(string *)local_98,parameters);
  psVar2 = FunctionSignature::str_abi_cxx11_(&local_78);
  std::__cxx11::string::string(local_58,(string *)psVar2);
  FunctionSignature::~FunctionSignature(&local_78);
  std::__cxx11::string::~string(local_98);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)initialSignature,local_58);
  }
  this_00 = VMState::binder(vmState);
  bVar1 = Binder::isDefined(this_00,(string *)local_58);
  if (bVar1) {
    std::__cxx11::string::string((string *)this,local_58);
  }
  else {
    pCVar4 = ClassType::metadata(classType);
    pCVar5 = ClassMetadata::parentClass(pCVar4);
    if (pCVar5 == (ClassType *)0x0) {
      std::__cxx11::string::string((string *)this,(string *)initialSignature);
    }
    else {
      pCVar4 = ClassType::metadata(classType);
      pCVar5 = ClassMetadata::parentClass(pCVar4);
      std::__cxx11::string::string(local_c8,(string *)name);
      std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
                (&local_e0,parameters);
      findInheritedMemberFunction(this,vmState,initialSignature,pCVar5,(string *)local_c8,&local_e0)
      ;
      std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c8);
    }
  }
  local_a8 = 1;
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

std::string findInheritedMemberFunction(const VMState& vmState,
												std::string& initialSignature,
												const ClassType* classType,
												std::string name,
												const std::vector<const Type*> parameters) {
			std::string signature = FunctionSignature::memberFunction(
				classType,
				name,
				parameters).str();

			if (initialSignature.empty()) {
				initialSignature = signature;
			}

			if (vmState.binder().isDefined(signature)) {
				return signature;
			}

			if (classType->metadata()->parentClass() != nullptr) {
				return findInheritedMemberFunction(
					vmState,
					initialSignature,
					classType->metadata()->parentClass(),
					name,
					parameters);
			} else {
				return initialSignature;
			}
		}